

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int quicly_build_session_ticket_auth_data(ptls_buffer_t *auth_data,quicly_context_t *ctx)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  uint8_t *puVar4;
  size_t sVar5;
  
  iVar3 = ptls_buffer__do_pushv(auth_data,"",1);
  if (iVar3 == 0) {
    sVar1 = auth_data->off;
    iVar3 = ptls_buffer_reserve(auth_data,8);
    if (iVar3 == 0) {
      puVar4 = auth_data->base;
      sVar2 = auth_data->off;
      puVar4[sVar2] = '\x0e';
      auth_data->off = (size_t)(puVar4 + (sVar2 - (long)auth_data->base) + 1);
      iVar3 = ptls_buffer__do_pushv(auth_data,"",1);
      if (iVar3 == 0) {
        sVar2 = auth_data->off;
        iVar3 = ptls_buffer_reserve(auth_data,8);
        if (iVar3 == 0) {
          puVar4 = ptls_encode_quicint(auth_data->base + auth_data->off,
                                       (ctx->transport_params).active_connection_id_limit);
          sVar5 = (long)puVar4 - (long)auth_data->base;
          auth_data->off = sVar5;
          iVar3 = ptls_buffer__adjust_quic_blocksize(auth_data,sVar5 - sVar2);
          if (iVar3 == 0) {
            iVar3 = ptls_buffer_reserve(auth_data,8);
            if (iVar3 == 0) {
              puVar4 = auth_data->base;
              sVar2 = auth_data->off;
              puVar4[sVar2] = '\x04';
              auth_data->off = (size_t)(puVar4 + (sVar2 - (long)auth_data->base) + 1);
              iVar3 = ptls_buffer__do_pushv(auth_data,"",1);
              if (iVar3 == 0) {
                sVar2 = auth_data->off;
                iVar3 = ptls_buffer_reserve(auth_data,8);
                if (iVar3 == 0) {
                  puVar4 = ptls_encode_quicint(auth_data->base + auth_data->off,
                                               (ctx->transport_params).max_data);
                  sVar5 = (long)puVar4 - (long)auth_data->base;
                  auth_data->off = sVar5;
                  iVar3 = ptls_buffer__adjust_quic_blocksize(auth_data,sVar5 - sVar2);
                  if (iVar3 == 0) {
                    iVar3 = ptls_buffer_reserve(auth_data,8);
                    if (iVar3 == 0) {
                      puVar4 = auth_data->base;
                      sVar2 = auth_data->off;
                      puVar4[sVar2] = '\x05';
                      auth_data->off = (size_t)(puVar4 + (sVar2 - (long)auth_data->base) + 1);
                      iVar3 = ptls_buffer__do_pushv(auth_data,"",1);
                      if (iVar3 == 0) {
                        sVar2 = auth_data->off;
                        iVar3 = ptls_buffer_reserve(auth_data,8);
                        if (iVar3 == 0) {
                          puVar4 = ptls_encode_quicint(auth_data->base + auth_data->off,
                                                       (ctx->transport_params).max_stream_data.
                                                       bidi_local);
                          sVar5 = (long)puVar4 - (long)auth_data->base;
                          auth_data->off = sVar5;
                          iVar3 = ptls_buffer__adjust_quic_blocksize(auth_data,sVar5 - sVar2);
                          if (iVar3 == 0) {
                            iVar3 = ptls_buffer_reserve(auth_data,8);
                            if (iVar3 == 0) {
                              puVar4 = auth_data->base;
                              sVar2 = auth_data->off;
                              puVar4[sVar2] = '\x06';
                              auth_data->off =
                                   (size_t)(puVar4 + (sVar2 - (long)auth_data->base) + 1);
                              iVar3 = ptls_buffer__do_pushv(auth_data,"",1);
                              if (iVar3 == 0) {
                                sVar2 = auth_data->off;
                                iVar3 = ptls_buffer_reserve(auth_data,8);
                                if (iVar3 == 0) {
                                  puVar4 = ptls_encode_quicint(auth_data->base + auth_data->off,
                                                               (ctx->transport_params).
                                                               max_stream_data.bidi_remote);
                                  sVar5 = (long)puVar4 - (long)auth_data->base;
                                  auth_data->off = sVar5;
                                  iVar3 = ptls_buffer__adjust_quic_blocksize
                                                    (auth_data,sVar5 - sVar2);
                                  if (iVar3 == 0) {
                                    iVar3 = ptls_buffer_reserve(auth_data,8);
                                    if (iVar3 == 0) {
                                      puVar4 = auth_data->base;
                                      sVar2 = auth_data->off;
                                      puVar4[sVar2] = '\a';
                                      auth_data->off =
                                           (size_t)(puVar4 + (sVar2 - (long)auth_data->base) + 1);
                                      iVar3 = ptls_buffer__do_pushv(auth_data,"",1);
                                      if (iVar3 == 0) {
                                        sVar2 = auth_data->off;
                                        iVar3 = ptls_buffer_reserve(auth_data,8);
                                        if (iVar3 == 0) {
                                          puVar4 = ptls_encode_quicint(auth_data->base +
                                                                       auth_data->off,
                                                                       (ctx->transport_params).
                                                                       max_stream_data.uni);
                                          sVar5 = (long)puVar4 - (long)auth_data->base;
                                          auth_data->off = sVar5;
                                          iVar3 = ptls_buffer__adjust_quic_blocksize
                                                            (auth_data,sVar5 - sVar2);
                                          if (iVar3 == 0) {
                                            iVar3 = ptls_buffer_reserve(auth_data,8);
                                            if (iVar3 == 0) {
                                              puVar4 = auth_data->base;
                                              sVar2 = auth_data->off;
                                              puVar4[sVar2] = '\b';
                                              auth_data->off =
                                                   (size_t)(puVar4 + (sVar2 - (long)auth_data->base)
                                                                     + 1);
                                              iVar3 = ptls_buffer__do_pushv(auth_data,"",1);
                                              if (iVar3 == 0) {
                                                sVar2 = auth_data->off;
                                                iVar3 = ptls_buffer_reserve(auth_data,8);
                                                if (iVar3 == 0) {
                                                  puVar4 = ptls_encode_quicint(auth_data->base +
                                                                               auth_data->off,
                                                                               (ctx->
                                                  transport_params).max_streams_bidi);
                                                  sVar5 = (long)puVar4 - (long)auth_data->base;
                                                  auth_data->off = sVar5;
                                                  iVar3 = ptls_buffer__adjust_quic_blocksize
                                                                    (auth_data,sVar5 - sVar2);
                                                  if (iVar3 == 0) {
                                                    iVar3 = ptls_buffer_reserve(auth_data,8);
                                                    if (iVar3 == 0) {
                                                      puVar4 = auth_data->base;
                                                      sVar2 = auth_data->off;
                                                      puVar4[sVar2] = '\t';
                                                      auth_data->off =
                                                           (size_t)(puVar4 + (sVar2 - (long)
                                                  auth_data->base) + 1);
                                                  iVar3 = ptls_buffer__do_pushv(auth_data,"",1);
                                                  if (iVar3 == 0) {
                                                    sVar2 = auth_data->off;
                                                    iVar3 = ptls_buffer_reserve(auth_data,8);
                                                    if (iVar3 == 0) {
                                                      puVar4 = ptls_encode_quicint(auth_data->base +
                                                                                   auth_data->off,
                                                                                   (ctx->
                                                  transport_params).max_streams_uni);
                                                  sVar5 = (long)puVar4 - (long)auth_data->base;
                                                  auth_data->off = sVar5;
                                                  iVar3 = ptls_buffer__adjust_quic_blocksize
                                                                    (auth_data,sVar5 - sVar2);
                                                  if (iVar3 == 0) {
                                                    iVar3 = ptls_buffer__adjust_quic_blocksize
                                                                      (auth_data,
                                                                       auth_data->off - sVar1);
                                                    return iVar3;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int quicly_build_session_ticket_auth_data(ptls_buffer_t *auth_data, const quicly_context_t *ctx)
{
    int ret;

#define PUSH_TP(id, block)                                                                                                         \
    do {                                                                                                                           \
        ptls_buffer_push_quicint(auth_data, id);                                                                                   \
        ptls_buffer_push_block(auth_data, -1, block);                                                                              \
    } while (0)

    ptls_buffer_push_block(auth_data, -1, {
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_ACTIVE_CONNECTION_ID_LIMIT,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.active_connection_id_limit); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_DATA,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_data); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_BIDI_LOCAL,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_stream_data.bidi_local); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_BIDI_REMOTE,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_stream_data.bidi_remote); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAM_DATA_UNI,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_stream_data.uni); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAMS_BIDI,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_streams_bidi); });
        PUSH_TP(QUICLY_TRANSPORT_PARAMETER_ID_INITIAL_MAX_STREAMS_UNI,
                { ptls_buffer_push_quicint(auth_data, ctx->transport_params.max_streams_uni); });
    });

#undef PUSH_TP

    ret = 0;
Exit:
    return ret;
}